

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendar.cpp
# Opt level: O2

void __thiscall QtPrivate::QCalendarRegistry::QCalendarRegistry(QCalendarRegistry *this)

{
  QReadWriteLock::QReadWriteLock(&this->lock,NonRecursive);
  (this->byName).c.values.
  super__Vector_base<QCalendarBackend_*,_std::allocator<QCalendarBackend_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->gregorianCalendar).super_QBasicAtomicPointer<const_QCalendarBackend>._q_value._M_b._M_p =
       (__pointer_type)0x0;
  (this->byName).c.values.
  super__Vector_base<QCalendarBackend_*,_std::allocator<QCalendarBackend_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->byName).c.values.
  super__Vector_base<QCalendarBackend_*,_std::allocator<QCalendarBackend_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->byName).c.keys.d.ptr = (QString *)0x0;
  (this->byName).c.keys.d.size = 0;
  (this->byId).super__Vector_base<QCalendarBackend_*,_std::allocator<QCalendarBackend_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->byName).c.keys.d.d = (Data *)0x0;
  (this->byId).super__Vector_base<QCalendarBackend_*,_std::allocator<QCalendarBackend_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->byId).super__Vector_base<QCalendarBackend_*,_std::allocator<QCalendarBackend_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->status).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  std::vector<QCalendarBackend_*,_std::allocator<QCalendarBackend_*>_>::resize(&this->byId,0xc);
  QFlatMap<QString,_QCalendarBackend_*,_QCalendarRegistryCaseInsensitiveAnyStringViewLessThan,_QList<QString>,_std::vector<QCalendarBackend_*,_std::allocator<QCalendarBackend_*>_>_>
  ::reserve(&this->byName,0x18);
  return;
}

Assistant:

QCalendarRegistry()
    {
        byId.resize(ExpectedNumberOfBackends);
        byName.reserve(ExpectedNumberOfBackends * 2); // assume one alias on average
    }